

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_allEqual_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int i;
  long lVar3;
  float local_28 [4];
  undefined1 local_18 [16];
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  local_18._12_4_ = auVar1._0_4_;
  local_18._0_12_ = auVar1._4_12_;
  local_28[0] = c->in[1].m_data[3];
  local_28[1] = c->in[1].m_data[2];
  local_28[2] = c->in[1].m_data[1];
  local_28[3] = c->in[1].m_data[0];
  bVar2 = true;
  lVar3 = 0;
  do {
    if (bVar2) {
      bVar2 = local_28[lVar3] == *(float *)(local_18 + lVar3 * 4);
    }
    else {
      bVar2 = false;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (c->color).m_data[0] = (float)bVar2;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }